

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_metric.hpp
# Opt level: O0

void ylt::metric::detail::stat_cpu(void)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  double usr_cpu_usage;
  double sys_cpu_usage;
  double cpu_usage;
  int64_t elapsed;
  int64_t now;
  int64_t time_total;
  int64_t stime;
  int64_t utime;
  rusage usage;
  allocator<char> *in_stack_fffffffffffffe78;
  basic_static_counter<long> *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffea0;
  static_metric_manager<ylt::metric::ylt_system_tag_t> *in_stack_fffffffffffffea8;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  rusage local_118;
  allocator<char> local_81 [40];
  allocator<char> local_59 [40];
  allocator<char> local_31 [49];
  
  if ((stat_cpu()::process_cpu_usage == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage), iVar4 != 0)) {
    in_stack_fffffffffffffea0 =
         (string *)static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
    std::allocator<char>::~allocator(local_31);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_cpu::process_cpu_usage,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage);
  }
  if ((stat_cpu()::process_cpu_usage_system == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_system), iVar4 != 0)) {
    static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
    std::allocator<char>::~allocator(local_59);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_cpu::process_cpu_usage_system,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_system);
  }
  if ((stat_cpu()::process_cpu_usage_user == '\0') &&
     (iVar4 = __cxa_guard_acquire(&stat_cpu()::process_cpu_usage_user), iVar4 != 0)) {
    in_stack_fffffffffffffe80 =
         (basic_static_counter<long> *)
         static_metric_manager<ylt::metric::ylt_system_tag_t>::instance();
    in_stack_fffffffffffffe78 = local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    static_metric_manager<ylt::metric::ylt_system_tag_t>::
    get_metric_static<ylt::metric::basic_static_gauge<long>>
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe80);
    std::allocator<char>::~allocator(local_81);
    __cxa_atexit(std::shared_ptr<ylt::metric::basic_static_gauge<long>_>::~shared_ptr,
                 &stat_cpu::process_cpu_usage_user,&__dso_handle);
    __cxa_guard_release(&stat_cpu()::process_cpu_usage_user);
  }
  memset(&local_118,0,0x90);
  getrusage(RUSAGE_SELF,&local_118);
  iVar5 = timeval_to_microseconds((timeval *)&local_118);
  iVar6 = timeval_to_microseconds((timeval *)&local_118.ru_stime);
  iVar7 = gettimeofday_us();
  iVar1 = iVar7;
  iVar2 = iVar6;
  iVar3 = iVar5;
  if ((last_time_us != 0) &&
     (iVar1 = last_time_us, iVar2 = last_sys_time_us, iVar3 = last_user_time_us,
     iVar7 != last_time_us)) {
    std::
    __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x27350f);
    basic_static_counter<long>::update(in_stack_fffffffffffffe80,(long)in_stack_fffffffffffffe78);
    std::
    __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x27352a);
    basic_static_counter<long>::update(in_stack_fffffffffffffe80,(long)in_stack_fffffffffffffe78);
    std::
    __shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x273545);
    basic_static_counter<long>::update(in_stack_fffffffffffffe80,(long)in_stack_fffffffffffffe78);
    iVar1 = iVar7;
    iVar2 = iVar6;
    iVar3 = iVar5;
  }
  last_user_time_us = iVar3;
  last_sys_time_us = iVar2;
  last_time_us = iVar1;
  return;
}

Assistant:

inline void stat_cpu() {
  static auto process_cpu_usage =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage");
  static auto process_cpu_usage_system =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_system");
  static auto process_cpu_usage_user =
      system_metric_manager::instance().get_metric_static<gauge_t>(
          "ylt_process_cpu_usage_user");

  rusage usage{};
  getrusage(RUSAGE_SELF, &usage);
  int64_t utime = timeval_to_microseconds(usage.ru_utime);
  int64_t stime = timeval_to_microseconds(usage.ru_stime);
  int64_t time_total = utime + stime;
  int64_t now = gettimeofday_us();
  if (last_time_us == 0) {
    last_time_us = now;
    last_sys_time_us = stime;
    last_user_time_us = utime;
    return;
  }

  int64_t elapsed = now - last_time_us;
  if (elapsed == 0) {
    return;
  }

  double cpu_usage =
      double(time_total - (last_sys_time_us + last_user_time_us)) /
      (now - last_time_us);
  double sys_cpu_usage =
      double(stime - last_sys_time_us) / (now - last_time_us);
  double usr_cpu_usage =
      double(utime - last_user_time_us) / (now - last_time_us);
  process_cpu_usage->update(cpu_usage);
  process_cpu_usage_system->update(sys_cpu_usage);
  process_cpu_usage_user->update(usr_cpu_usage);

  last_time_us = now;
  last_sys_time_us = stime;
  last_user_time_us = utime;
}